

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringLenMethod::eval
          (StringLenMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  string *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  Expression *in_RDI;
  ConstantValue val;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  EvalContext *in_stack_ffffffffffffff60;
  bitwidth_t bits;
  Expression *this_01;
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_RDI,in_stack_ffffffffffffff60);
  bits = (bitwidth_t)((ulong)in_RDI >> 0x20);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x97c32b);
  if (bVar1) {
    this_00 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x97c375);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length(this_00)
    ;
    SVInt::SVInt((SVInt *)this_01,bits,(uint64_t)this_00,(bool)in_stack_ffffffffffffff5f);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)this_00,
               (SVInt *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    SVInt::~SVInt((SVInt *)this_01);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff60,
               (nullptr_t)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x97c3e8);
  return (ConstantValue *)this_01;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        return SVInt(32, val.str().length(), true);
    }